

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_hash.cc
# Opt level: O1

uint64_t absl::lts_20240722::hash_internal::LowLevelHashLenGt16
                   (void *data,size_t len,uint64_t seed,uint64_t *salt)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong *puVar26;
  
  uVar21 = seed ^ *salt;
  uVar25 = len;
  puVar26 = (ulong *)data;
  if (0x40 < len) {
    uVar22 = uVar21;
    uVar23 = uVar21;
    uVar24 = uVar21;
    do {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *puVar26 ^ salt[1];
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar22 ^ puVar26[1];
      uVar22 = SUB168(auVar5 * auVar13,8) ^ SUB168(auVar5 * auVar13,0);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = puVar26[2] ^ salt[2];
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar23 ^ puVar26[3];
      uVar23 = SUB168(auVar6 * auVar14,8) ^ SUB168(auVar6 * auVar14,0);
      puVar1 = puVar26 + 4;
      puVar2 = puVar26 + 5;
      puVar3 = puVar26 + 6;
      puVar4 = puVar26 + 7;
      puVar26 = puVar26 + 8;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *puVar1 ^ salt[3];
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar24 ^ *puVar2;
      uVar24 = SUB168(auVar7 * auVar15,8) ^ SUB168(auVar7 * auVar15,0);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *puVar3 ^ salt[4];
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar21 ^ *puVar4;
      uVar21 = SUB168(auVar8 * auVar16,8) ^ SUB168(auVar8 * auVar16,0);
      uVar25 = uVar25 - 0x40;
    } while (0x40 < uVar25);
    uVar21 = uVar21 + uVar24 ^ uVar22 ^ uVar23;
  }
  if (0x20 < uVar25) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = salt[1] ^ *puVar26;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = puVar26[1] ^ uVar21;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = salt[2] ^ puVar26[2];
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar21 ^ puVar26[3];
    uVar21 = SUB168(auVar10 * auVar18,8) ^ SUB168(auVar9 * auVar17,8) ^ SUB168(auVar9 * auVar17,0) ^
             SUB168(auVar10 * auVar18,0);
    puVar26 = puVar26 + 4;
    uVar25 = uVar25 - 0x20;
  }
  if (0x10 < uVar25) {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = salt[1] ^ *puVar26;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar21 ^ puVar26[1];
    uVar21 = SUB168(auVar11 * auVar19,8) ^ SUB168(auVar11 * auVar19,0);
  }
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)((long)data + (len - 0x10)) ^ salt[1] ^ len;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar21 ^ *(ulong *)((long)data + (len - 8));
  return SUB168(auVar12 * auVar20,0) ^ SUB168(auVar12 * auVar20,8);
}

Assistant:

uint64_t LowLevelHashLenGt16(const void* data, size_t len, uint64_t seed,
                             const uint64_t salt[5]) {
  // Prefetch the cacheline that data resides in.
  PrefetchToLocalCache(data);
  const uint8_t* ptr = static_cast<const uint8_t*>(data);
  uint64_t starting_length = static_cast<uint64_t>(len);
  const uint8_t* last_16_ptr = ptr + starting_length - 16;
  uint64_t current_state = seed ^ salt[0];

  if (len > 64) {
    // If we have more than 64 bytes, we're going to handle chunks of 64
    // bytes at a time. We're going to build up two separate hash states
    // which we will then hash together.
    uint64_t duplicated_state0 = current_state;
    uint64_t duplicated_state1 = current_state;
    uint64_t duplicated_state2 = current_state;

    do {
      // Always prefetch the next cacheline.
      PrefetchToLocalCache(ptr + ABSL_CACHELINE_SIZE);

      uint64_t a = absl::base_internal::UnalignedLoad64(ptr);
      uint64_t b = absl::base_internal::UnalignedLoad64(ptr + 8);
      uint64_t c = absl::base_internal::UnalignedLoad64(ptr + 16);
      uint64_t d = absl::base_internal::UnalignedLoad64(ptr + 24);
      uint64_t e = absl::base_internal::UnalignedLoad64(ptr + 32);
      uint64_t f = absl::base_internal::UnalignedLoad64(ptr + 40);
      uint64_t g = absl::base_internal::UnalignedLoad64(ptr + 48);
      uint64_t h = absl::base_internal::UnalignedLoad64(ptr + 56);

      current_state = Mix(a ^ salt[1], b ^ current_state);
      duplicated_state0 = Mix(c ^ salt[2], d ^ duplicated_state0);

      duplicated_state1 = Mix(e ^ salt[3], f ^ duplicated_state1);
      duplicated_state2 = Mix(g ^ salt[4], h ^ duplicated_state2);

      ptr += 64;
      len -= 64;
    } while (len > 64);

    current_state = (current_state ^ duplicated_state0) ^
                    (duplicated_state1 + duplicated_state2);
  }

  // We now have a data `ptr` with at most 64 bytes and the current state
  // of the hashing state machine stored in current_state.
  if (len > 32) {
    uint64_t a = absl::base_internal::UnalignedLoad64(ptr);
    uint64_t b = absl::base_internal::UnalignedLoad64(ptr + 8);
    uint64_t c = absl::base_internal::UnalignedLoad64(ptr + 16);
    uint64_t d = absl::base_internal::UnalignedLoad64(ptr + 24);

    uint64_t cs0 = Mix(a ^ salt[1], b ^ current_state);
    uint64_t cs1 = Mix(c ^ salt[2], d ^ current_state);
    current_state = cs0 ^ cs1;

    ptr += 32;
    len -= 32;
  }

  // We now have a data `ptr` with at most 32 bytes and the current state
  // of the hashing state machine stored in current_state.
  if (len > 16) {
    uint64_t a = absl::base_internal::UnalignedLoad64(ptr);
    uint64_t b = absl::base_internal::UnalignedLoad64(ptr + 8);

    current_state = Mix(a ^ salt[1], b ^ current_state);
  }

  // We now have a data `ptr` with at least 1 and at most 16 bytes. But we can
  // safely read from `ptr + len - 16`.
  uint64_t a = absl::base_internal::UnalignedLoad64(last_16_ptr);
  uint64_t b = absl::base_internal::UnalignedLoad64(last_16_ptr + 8);

  return Mix(a ^ salt[1] ^ starting_length, b ^ current_state);
}